

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char8_t * fmt::v5::internal::
          format_decimal<fmt::v5::char8_t,unsigned_long,fmt::v5::char8_t*,fmt::v5::internal::no_thousands_sep>
                    (char8_t *out)

{
  char8_t *pcVar1;
  char8_t *pcVar2;
  char_type buffer [26];
  char8_t local_38 [40];
  
  pcVar1 = (char8_t *)
           format_decimal<unsigned_long,char,fmt::v5::internal::no_thousands_sep>(local_38);
  for (pcVar2 = local_38; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    *out = *pcVar2;
    out = out + 1;
  }
  return out;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}